

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O2

int mbedtls_pkcs5_self_test(int verbose)

{
  uint key_length;
  int iVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  long lVar3;
  long lVar4;
  long lVar5;
  uint local_9c;
  uchar (*local_98) [40];
  mbedtls_md_context_t sha1_ctx;
  uchar key [64];
  
  mbedtls_md_init(&sha1_ctx);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  if (md_info == (mbedtls_md_info_t *)0x0) {
LAB_0017e97d:
    iVar2 = 1;
  }
  else {
    iVar2 = 1;
    iVar1 = mbedtls_md_setup(&sha1_ctx,md_info,1);
    if (iVar1 == 0) {
      local_98 = salt;
      local_9c = 0;
      lVar3 = 0;
      lVar5 = 0;
      for (lVar4 = 0; lVar4 != 0xc0; lVar4 = lVar4 + 0x20) {
        if (verbose != 0) {
          printf("  PBKDF2 (SHA1) #%d: ",(ulong)local_9c);
        }
        key_length = *(uint *)((long)key_len + lVar5);
        iVar2 = mbedtls_pkcs5_pbkdf2_hmac
                          (&sha1_ctx,password[0] + lVar4,*(size_t *)((long)plen + lVar3),*local_98,
                           *(size_t *)((long)slen + lVar3),*(uint *)((long)it_cnt + lVar5),
                           key_length,key);
        if (iVar2 != 0) {
LAB_0017e96c:
          if (verbose != 0) {
            puts("failed");
          }
          goto LAB_0017e97d;
        }
        iVar2 = bcmp(result_key[0] + lVar4,key,(ulong)key_length);
        if (iVar2 != 0) goto LAB_0017e96c;
        if (verbose != 0) {
          puts("passed");
        }
        lVar5 = lVar5 + 4;
        lVar3 = lVar3 + 8;
        local_98 = local_98 + 1;
        local_9c = local_9c + 1;
      }
      putchar(10);
      iVar2 = 0;
    }
  }
  mbedtls_md_free(&sha1_ctx);
  return iVar2;
}

Assistant:

int mbedtls_pkcs5_self_test( int verbose )
{
    mbedtls_md_context_t sha1_ctx;
    const mbedtls_md_info_t *info_sha1;
    int ret, i;
    unsigned char key[64];

    mbedtls_md_init( &sha1_ctx );

    info_sha1 = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );
    if( info_sha1 == NULL )
    {
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_md_setup( &sha1_ctx, info_sha1, 1 ) ) != 0 )
    {
        ret = 1;
        goto exit;
    }

    for( i = 0; i < MAX_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  PBKDF2 (SHA1) #%d: ", i );

        ret = mbedtls_pkcs5_pbkdf2_hmac( &sha1_ctx, password[i], plen[i], salt[i],
                                  slen[i], it_cnt[i], key_len[i], key );
        if( ret != 0 ||
            memcmp( result_key[i], key, key_len[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    mbedtls_printf( "\n" );

exit:
    mbedtls_md_free( &sha1_ctx );

    return( ret );
}